

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O1

void __thiscall ThreadedReplayer::sync_worker_threads(ThreadedReplayer *this)

{
  uint i;
  long lVar1;
  
  lVar1 = 0;
  do {
    sync_worker_memory_context(this,(uint)lVar1);
    if (this->memory_context_pipeline_cache[lVar1] != (VkPipelineCache)0x0) {
      (*vkDestroyPipelineCache)
                (((this->device)._M_t.
                  super___uniq_ptr_impl<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Fossilize::VulkanDevice_*,_std::default_delete<Fossilize::VulkanDevice>_>
                  .super__Head_base<0UL,_Fossilize::VulkanDevice_*,_false>._M_head_impl)->device,
                 this->memory_context_pipeline_cache[lVar1],(VkAllocationCallbacks *)0x0);
    }
    this->memory_context_pipeline_cache[lVar1] = (VkPipelineCache)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void sync_worker_threads()
	{
		for (unsigned i = 0; i < NUM_MEMORY_CONTEXTS; i++)
		{
			sync_worker_memory_context(i);
			if (memory_context_pipeline_cache[i])
				vkDestroyPipelineCache(device->get_device(), memory_context_pipeline_cache[i], nullptr);
			memory_context_pipeline_cache[i] = VK_NULL_HANDLE;
		}
	}